

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

int If_Dec7SuppSize(word *t)

{
  int local_40;
  int local_3c;
  int Count;
  int v;
  word c1 [2];
  word c0 [2];
  word *t_local;
  
  local_40 = 0;
  for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
    If_Dec7Cofactor(t,local_3c,0,c1 + 1);
    If_Dec7Cofactor(t,local_3c,1,(word *)&Count);
    if ((c1[1] != _Count) || (c0[0] != c1[0])) {
      local_40 = local_40 + 1;
    }
  }
  return local_40;
}

Assistant:

static inline int If_Dec7SuppSize( word t[2] )
{
    word c0[2], c1[2];
    int v, Count = 0;
    for ( v = 0; v < 7; v++ )
    {
        If_Dec7Cofactor( t, v, 0, c0 );
        If_Dec7Cofactor( t, v, 1, c1 );
        if ( c0[0] != c1[0] || c0[1] != c1[1] )
            Count++;
    }
    return Count;
}